

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall
duckdb::Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::ColumnBinding,true>>
          (Serializer *this,field_id_t field_id,char *tag,vector<duckdb::ColumnBinding,_true> *value
          )

{
  bool bVar1;
  undefined8 in_RDX;
  undefined2 in_SI;
  long *in_RDI;
  
  if (((*(byte *)((long)in_RDI + 9) & 1) == 0) &&
     (bVar1 = SerializationDefaultValue::IsDefault<duckdb::vector<duckdb::ColumnBinding,true>>
                        ((type *)0xaf27f4), bVar1)) {
    (**(code **)(*in_RDI + 0x20))(in_RDI,in_SI,in_RDX,0);
    (**(code **)(*in_RDI + 0x28))(in_RDI,0);
  }
  else {
    (**(code **)(*in_RDI + 0x20))(in_RDI,in_SI,in_RDX,1);
    WriteValue<duckdb::ColumnBinding>((Serializer *)tag,value);
    (**(code **)(*in_RDI + 0x28))(in_RDI,1);
  }
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && SerializationDefaultValue::IsDefault<T>(value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}